

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O1

Status __thiscall spvtools::opt::ReduceLoadSize::Process(ReduceLoadSize *this)

{
  Module *pMVar1;
  pointer puVar2;
  pointer puVar3;
  bool modified;
  byte local_59;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_59 = 0;
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar3 = *(pointer *)
            &(pMVar1->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  if (puVar3 != puVar2) {
    do {
      local_58._M_unused._M_object = &local_59;
      pcStack_40 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:37:22)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:37:22)>
                 ::_M_manager;
      local_58._8_8_ = this;
      opt::Function::ForEachInst
                ((Function *)
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ,(function<void_(spvtools::opt::Instruction_*)> *)&local_58,false,false);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  return local_59 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status ReduceLoadSize::Process() {
  bool modified = false;

  for (auto& func : *get_module()) {
    func.ForEachInst([&modified, this](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpCompositeExtract) {
        if (ShouldReplaceExtract(inst)) {
          modified |= ReplaceExtract(inst);
        }
      }
    });
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}